

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O3

bool tinyusdz::tydra::detail::BuildSkelHierarchyImpl
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *visitSet,SkelNode *parentNode,vector<int,_std::allocator<int>_> *parentJointIds,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames_00;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *__x;
  pointer piVar1;
  long lVar2;
  pointer piVar3;
  _Base_ptr p_Var4;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *pvVar5;
  pointer pmVar6;
  _Base_ptr p_Var7;
  double *pdVar8;
  _Rb_tree_header *p_Var9;
  byte bVar10;
  string *in_stack_fffffffffffffe10;
  unsigned_long local_1e8;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *local_1e0;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> *local_1d8;
  _Rb_tree_header *local_1d0;
  SkelNode *local_1c8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_1c0;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *local_1b8;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> *local_1b0;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_1a8;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  int local_150;
  double local_148;
  double local_140;
  double dStack_138;
  double local_130;
  double dStack_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double dStack_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double local_50;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> local_48;
  
  bVar10 = 0;
  local_1e8 = 0;
  piVar1 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar3 != piVar1) {
    p_Var9 = &(visitSet->_M_t)._M_impl.super__Rb_tree_header;
    pvVar5 = &local_48;
    local_1d8 = &parentNode->children;
    local_1e0 = pvVar5;
    local_1d0 = p_Var9;
    local_1c8 = parentNode;
    local_1c0 = joints;
    local_1b8 = jointNames;
    local_1b0 = bindTransforms;
    do {
      joints_00 = local_1c0;
      local_170._M_p = (pointer)&local_160;
      local_190._0_8_ = local_190 + 0x10;
      p_Var4 = (visitSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var9->_M_header;
      if (p_Var4 == (_Base_ptr)0x0) {
LAB_00346059:
        if (parentNode->joint_id == piVar1[local_1e8]) {
          local_190._8_8_ = 0;
          local_190[0x10] = '\0';
          local_168 = 0;
          local_160._M_local_buf[0] = '\0';
          local_148 = 1.0;
          local_130 = 0.0;
          dStack_128 = 0.0;
          local_140 = 0.0;
          dStack_138 = 0.0;
          local_120 = 1.0;
          local_108 = 0.0;
          dStack_100 = 0.0;
          local_118 = 0.0;
          dStack_110 = 0.0;
          local_f8 = 1.0;
          local_e0 = 0.0;
          dStack_d8 = 0.0;
          local_f0 = 0.0;
          dStack_e8 = 0.0;
          local_d0 = 1.0;
          dStack_c8 = 1.0;
          local_b0 = 0.0;
          dStack_a8 = 0.0;
          local_c0 = 0.0;
          dStack_b8 = 0.0;
          local_a0 = 1.0;
          local_88 = 0.0;
          dStack_80 = 0.0;
          local_98 = 0.0;
          dStack_90 = 0.0;
          local_78 = 1.0;
          local_60 = 0.0;
          dStack_58 = 0.0;
          local_70 = 0.0;
          dStack_68 = 0.0;
          local_50 = 1.0;
          (pvVar5->
          super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pvVar5->
          super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>)
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (pvVar5->
          super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>)
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_150 = (int)local_1e8;
          ::std::__cxx11::string::_M_assign((string *)local_190);
          jointNames_00 = local_1b8;
          ::std::__cxx11::string::_M_assign((string *)&local_170);
          __x = local_1b0;
          pmVar6 = (local_1b0->
                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_1e8;
          pdVar8 = &local_148;
          for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
            *pdVar8 = pmVar6->m[0][0];
            pmVar6 = (pointer)((long)pmVar6 + ((ulong)bVar10 * -2 + 1) * 8);
            pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
          }
          pmVar6 = (restTransforms->
                   super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                   )._M_impl.super__Vector_impl_data._M_start + local_1e8;
          pdVar8 = &dStack_c8;
          for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
            *pdVar8 = pmVar6->m[0][0];
            pmVar6 = (pointer)((long)pmVar6 + ((ulong)bVar10 * -2 + 1) * 8);
            pdVar8 = pdVar8 + (ulong)bVar10 * -2 + 1;
          }
          ::std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>
                    ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                      *)visitSet,&local_1e8);
          ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::
          vector(&local_1a8,__x);
          BuildSkelHierarchyImpl
                    (visitSet,(SkelNode *)local_190,parentJointIds,joints_00,jointNames_00,
                     &local_1a8,restTransforms,in_stack_fffffffffffffe10);
          if (local_1a8.
              super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.
                            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a8.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8.
                                  super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
          emplace_back<tinyusdz::tydra::SkelNode>(local_1d8,(SkelNode *)local_190);
          pvVar5 = local_1e0;
          ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
          ~vector(local_1e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_p != &local_160) {
            operator_delete(local_170._M_p,
                            CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
            operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
          }
          piVar1 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar3 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          parentNode = local_1c8;
          p_Var9 = local_1d0;
        }
      }
      else {
        do {
          if (*(ulong *)(p_Var4 + 1) >= local_1e8) {
            p_Var7 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < local_1e8];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 == p_Var9) ||
           (local_1e8 < ((_Rb_tree_header *)p_Var7)->_M_node_count)) goto LAB_00346059;
      }
      local_1e8 = local_1e8 + 1;
    } while (local_1e8 < (ulong)((long)piVar3 - (long)piVar1 >> 2));
  }
  return SUB81(piVar1,0);
}

Assistant:

static bool BuildSkelHierarchyImpl(
    /* inout */ std::set<size_t> &visitSet,
    /* inout */ SkelNode &parentNode,
    const std::vector<int> &parentJointIds,
    const std::vector<value::token> &joints,
    const std::vector<value::token> &jointNames,
    const std::vector<value::matrix4d> bindTransforms,
    const std::vector<value::matrix4d> &restTransforms,
    std::string *err = nullptr) {
  // Simple linear search
  for (size_t i = 0; i < parentJointIds.size(); i++) {
    if (visitSet.count(i)) {
      continue;
    }

    int parentJointIdOfCurrIdx = parentJointIds[i];
    if (parentNode.joint_id == parentJointIdOfCurrIdx) {
      DCOUT("add joint " << i << "(parent = " << parentJointIdOfCurrIdx << ")");
      SkelNode node;
      node.joint_id = int(i);
      node.joint_path = joints[i].str();
      node.joint_name = jointNames[i].str();
      node.bind_transform = bindTransforms[i];
      node.rest_transform = restTransforms[i];

      visitSet.insert(i);

      // Recursively traverse children
      if (!BuildSkelHierarchyImpl(visitSet, node,
                                  parentJointIds, joints, jointNames, bindTransforms,
                                  restTransforms, err)) {
        return false;
      }

      parentNode.children.emplace_back(std::move(node));
    }
  }

  return true;
}